

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

SegmentWordCount capnp::_::verifySegmentSize(size_t size)

{
  size_t size_local;
  Fault local_10;
  
  if (size < 0x20000000) {
    return (SegmentWordCount)size;
  }
  size_local = size;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21],unsigned_long&>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
             ,0x46,FAILED,(char *)0x0,"\"segment is too large\", size",
             (char (*) [21])"segment is too large",&size_local);
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

static SegmentWordCount verifySegmentSize(size_t size) {
  auto gsize = bounded(size) * WORDS;
  return assertMaxBits<SEGMENT_WORD_COUNT_BITS>(gsize, [&]() {
    KJ_FAIL_REQUIRE("segment is too large", size);
  });
}